

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O2

Vec3<float> __thiscall Imath_3_2::hsv2rgb<float>(Imath_3_2 *this,Vec3<float> *hsv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Db;
  Vec3<float> VVar3;
  Vec3<double> c;
  double local_48;
  double dStack_40;
  double local_38;
  undefined1 local_28 [16];
  double local_18;
  
  local_18 = (double)hsv->z;
  uVar1 = hsv->x;
  uVar2 = hsv->y;
  local_28._8_4_ = SUB84((double)(float)uVar2,0);
  local_28._0_8_ = (double)(float)uVar1;
  local_28._12_4_ = (int)((ulong)(double)(float)uVar2 >> 0x20);
  Imath_3_2::hsv2rgb_d((Vec3 *)&local_48);
  VVar3.x = (float)local_38;
  VVar3.y = (float)extraout_XMM0_Db;
  VVar3.z = (float)local_48;
  *(ulong *)this = CONCAT44((float)dStack_40,VVar3.z);
  *(float *)(this + 8) = VVar3.x;
  return VVar3;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 Vec3<T>
                                   hsv2rgb (const Vec3<T>& hsv) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        Vec3<double> v = Vec3<double> (
            hsv.x / double (std::numeric_limits<T>::max ()),
            hsv.y / double (std::numeric_limits<T>::max ()),
            hsv.z / double (std::numeric_limits<T>::max ()));
        Vec3<double> c = hsv2rgb_d (v);
        return Vec3<T> (
            (T) (c.x * std::numeric_limits<T>::max ()),
            (T) (c.y * std::numeric_limits<T>::max ()),
            (T) (c.z * std::numeric_limits<T>::max ()));
    }
    else
    {
        Vec3<double> v = Vec3<double> (hsv.x, hsv.y, hsv.z);
        Vec3<double> c = hsv2rgb_d (v);
        return Vec3<T> ((T) c.x, (T) c.y, (T) c.z);
    }
}